

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

void __thiscall model::updateW(model *this,uint i)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  fVar1 = (this->z).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[i];
  fVar2 = this->lambda1;
  fVar5 = 0.0;
  if (fVar2 < ABS(fVar1)) {
    fVar5 = *(float *)(&DAT_00103058 + (ulong)(fVar1 < 0.0) * 4);
    fVar3 = this->beta;
    fVar4 = (this->n).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[i];
    if (fVar4 < 0.0) {
      fVar4 = sqrtf(fVar4);
    }
    else {
      fVar4 = SQRT(fVar4);
    }
    fVar5 = -(fVar2 * fVar5 + fVar1) / ((fVar3 + fVar4) / this->alpha + this->lambda2);
  }
  (this->w).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start[i] = fVar5;
  return;
}

Assistant:

void model::updateW(unsigned int i) {
    if (abs(z[i]) <= lambda1) {
        w[i] = 0;
    } else {
        w[i] = -(z[i] - sign(z[i]) * lambda1) / ((beta + sqrt(n[i])) / alpha + lambda2);
    }
}